

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::anon_unknown_1::printTotals(ostream *out,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  _anonymous_namespace_ *this;
  size_t count;
  size_t count_00;
  size_t count_01;
  size_t count_02;
  allocator<char> local_2d9;
  string local_2d8;
  pluralise local_2b8;
  allocator<char> local_289;
  string local_288;
  pluralise local_268;
  string local_240;
  Colour local_21a;
  allocator<char> local_219;
  undefined1 local_218 [6];
  Colour colour_2;
  pluralise local_1f8;
  allocator<char> local_1c9;
  string local_1c8;
  pluralise local_1a8;
  Colour local_17a;
  allocator<char> local_179;
  undefined1 local_178 [6];
  Colour colour_1;
  pluralise local_158;
  string local_130;
  allocator<char> local_109;
  string local_108;
  pluralise local_e8;
  allocator<char> local_b9;
  string local_b8;
  pluralise local_98;
  string local_70;
  undefined1 local_40 [8];
  string qualify_assertions_failed;
  Colour colour;
  Totals *totals_local;
  ostream *out_local;
  
  sVar1 = Counts::total(&totals->testCases);
  if (sVar1 == 0) {
    std::operator<<(out,"No tests ran.");
  }
  else {
    sVar1 = (totals->testCases).failed;
    sVar2 = Counts::total(&totals->testCases);
    if (sVar1 == sVar2) {
      Colour::Colour((Colour *)(qualify_assertions_failed.field_2._M_local_buf + 0xf),BrightRed);
      sVar1 = (totals->assertions).failed;
      sVar2 = Counts::total(&totals->assertions);
      if (sVar1 == sVar2) {
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                  ((string *)local_40,(_anonymous_namespace_ *)(totals->assertions).failed,count);
      }
      else {
        std::__cxx11::string::string((string *)local_40);
      }
      poVar3 = std::operator<<(out,"Failed ");
      ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)(totals->testCases).failed,count_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_70);
      sVar1 = (totals->testCases).failed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"test case",&local_b9);
      pluralise::pluralise(&local_98,sVar1,&local_b8);
      poVar3 = Catch::operator<<(poVar3,&local_98);
      poVar3 = std::operator<<(poVar3,", failed ");
      poVar3 = std::operator<<(poVar3,(string *)local_40);
      sVar1 = (totals->assertions).failed;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"assertion",&local_109);
      pluralise::pluralise(&local_e8,sVar1,&local_108);
      poVar3 = Catch::operator<<(poVar3,&local_e8);
      std::operator<<(poVar3,'.');
      pluralise::~pluralise(&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      pluralise::~pluralise(&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)local_40);
      Colour::~Colour((Colour *)(qualify_assertions_failed.field_2._M_local_buf + 0xf));
    }
    else {
      sVar1 = Counts::total(&totals->assertions);
      if (sVar1 == 0) {
        poVar3 = std::operator<<(out,"Passed ");
        this = (_anonymous_namespace_ *)Counts::total(&totals->testCases);
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_(&local_130,this,count_01);
        poVar3 = std::operator<<(poVar3,(string *)&local_130);
        sVar1 = Counts::total(&totals->testCases);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_178,"test case",&local_179);
        pluralise::pluralise(&local_158,sVar1,(string *)local_178);
        poVar3 = Catch::operator<<(poVar3,&local_158);
        std::operator<<(poVar3," (no assertions).");
        pluralise::~pluralise(&local_158);
        std::__cxx11::string::~string((string *)local_178);
        std::allocator<char>::~allocator(&local_179);
        std::__cxx11::string::~string((string *)&local_130);
      }
      else if ((totals->assertions).failed == 0) {
        Colour::Colour(&local_21a,BrightGreen);
        poVar3 = std::operator<<(out,"Passed ");
        ::(anonymous_namespace)::bothOrAll_abi_cxx11_
                  (&local_240,(_anonymous_namespace_ *)(totals->testCases).passed,count_02);
        poVar3 = std::operator<<(poVar3,(string *)&local_240);
        sVar1 = (totals->testCases).passed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,"test case",&local_289);
        pluralise::pluralise(&local_268,sVar1,&local_288);
        poVar3 = Catch::operator<<(poVar3,&local_268);
        poVar3 = std::operator<<(poVar3," with ");
        sVar1 = (totals->assertions).passed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"assertion",&local_2d9);
        pluralise::pluralise(&local_2b8,sVar1,&local_2d8);
        poVar3 = Catch::operator<<(poVar3,&local_2b8);
        std::operator<<(poVar3,'.');
        pluralise::~pluralise(&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::~allocator(&local_2d9);
        pluralise::~pluralise(&local_268);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator(&local_289);
        std::__cxx11::string::~string((string *)&local_240);
        Colour::~Colour(&local_21a);
      }
      else {
        Colour::Colour(&local_17a,BrightRed);
        poVar3 = std::operator<<(out,"Failed ");
        sVar1 = (totals->testCases).failed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"test case",&local_1c9);
        pluralise::pluralise(&local_1a8,sVar1,&local_1c8);
        poVar3 = Catch::operator<<(poVar3,&local_1a8);
        poVar3 = std::operator<<(poVar3,", failed ");
        sVar1 = (totals->assertions).failed;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218,"assertion",&local_219);
        pluralise::pluralise(&local_1f8,sVar1,(string *)local_218);
        poVar3 = Catch::operator<<(poVar3,&local_1f8);
        std::operator<<(poVar3,'.');
        pluralise::~pluralise(&local_1f8);
        std::__cxx11::string::~string((string *)local_218);
        std::allocator<char>::~allocator(&local_219);
        pluralise::~pluralise(&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        Colour::~Colour(&local_17a);
      }
    }
  }
  return;
}

Assistant:

void printTotals(std::ostream &out, const Totals &totals) {
      if (totals.testCases.total() == 0) {
        out << "No tests ran.";
      } else if (totals.testCases.failed == totals.testCases.total()) {
        Colour colour(Colour::ResultError);
        const std::string qualify_assertions_failed
            = totals.assertions.failed == totals.assertions.total() ? bothOrAll(totals.assertions.failed) : std::string();
        out << "Failed " << bothOrAll(totals.testCases.failed) << pluralise(totals.testCases.failed, "test case")
            << ", "
               "failed "
            << qualify_assertions_failed << pluralise(totals.assertions.failed, "assertion") << '.';
      } else if (totals.assertions.total() == 0) {
        out << "Passed " << bothOrAll(totals.testCases.total()) << pluralise(totals.testCases.total(), "test case") << " (no assertions).";
      } else if (totals.assertions.failed) {
        Colour colour(Colour::ResultError);
        out << "Failed " << pluralise(totals.testCases.failed, "test case")
            << ", "
               "failed "
            << pluralise(totals.assertions.failed, "assertion") << '.';
      } else {
        Colour colour(Colour::ResultSuccess);
        out << "Passed " << bothOrAll(totals.testCases.passed) << pluralise(totals.testCases.passed, "test case") << " with "
            << pluralise(totals.assertions.passed, "assertion") << '.';
      }
    }